

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_projection_code(parser *p)

{
  int iVar1;
  char *__s1;
  int *piVar2;
  int *v;
  int local_3c;
  projection *projection;
  wchar_t index;
  projection *h;
  char *code;
  parser *p_local;
  
  __s1 = parser_getstr(p,"code");
  piVar2 = (int *)parser_priv(p);
  if (piVar2 == (int *)0x0) {
    local_3c = 0;
  }
  else {
    local_3c = *piVar2 + 1;
  }
  v = (int *)mem_zalloc(0x68);
  parser_setpriv(p,v);
  *(int **)(v + 0x18) = piVar2;
  *v = local_3c;
  if ((local_3c < 0x19) && (iVar1 = strcmp(__s1,element_names[local_3c]), iVar1 != 0)) {
    return PARSE_ERROR_ELEMENT_NAME_MISMATCH;
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_projection_code(struct parser *p) {
	const char *code = parser_getstr(p, "code");
	struct projection *h = parser_priv(p);
	int index = h ? h->index + 1 : 0;
	struct projection *projection = mem_zalloc(sizeof *projection);

	parser_setpriv(p, projection);
	projection->next = h;
	projection->index = index;
	if ((index < ELEM_MAX) && !streq(code, element_names[index])) {
		return PARSE_ERROR_ELEMENT_NAME_MISMATCH;
	}
	return PARSE_ERROR_NONE;
}